

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O1

void __thiscall amrex::BLBTer::BLBTer(BLBTer *this,string *s,char *file,int line)

{
  ostream *poVar1;
  size_t sVar2;
  ostringstream ss0;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->line_file)._M_dataplus._M_p = (pointer)&(this->line_file).field_2;
  (this->line_file)._M_string_length = 0;
  (this->line_file).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Line ",5);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", File ",7);
  if (file == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,file,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_320);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Proc. ",6);
  poVar1 = (ostream *)std::ostream::operator<<(local_320,*(int *)(ParallelContext::frames + 0xc));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": \"",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_360,&local_380,&this->line_file);
  std::
  deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)BLBackTrace::bt_stack_abi_cxx11_,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.second._M_dataplus._M_p != &local_360.second.field_2) {
    operator_delete(local_360.second._M_dataplus._M_p,
                    local_360.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.first._M_dataplus._M_p != &local_360.first.field_2) {
    operator_delete(local_360.first._M_dataplus._M_p,
                    local_360.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

BLBTer::BLBTer(const std::string& s, const char* file, int line)
{
    std::ostringstream ss;
    ss << "Line " << line << ", File " << file;
    line_file = ss.str();

#ifdef AMREX_USE_OMP
    if (omp_in_parallel()) {
        std::ostringstream ss0;
        ss0 << "Proc. " << ParallelDescriptor::MyProc()
            << ", Thread " << omp_get_thread_num()
            << ": \"" << s << "\"";
        BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
    }
    else {
        #pragma omp parallel
        {
            std::ostringstream ss0;
            ss0 << "Proc. " << ParallelDescriptor::MyProc()
                << ", Master Thread"
                << ": \"" << s << "\"";
            BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
        }
    }
#else
    std::ostringstream ss0;
    ss0 << "Proc. " << ParallelDescriptor::MyProc()
        << ": \"" << s << "\"";
    BLBackTrace::bt_stack.push(std::make_pair(ss0.str(), line_file));
#endif
}